

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCryptionCommon.cpp
# Opt level: O0

ByteList * __thiscall
XCryptionCommon::OnObjectStart_abi_cxx11_
          (XCryptionCommon *this,longlong inObjectID,longlong inGenerationNumber)

{
  reference pvVar1;
  ByteList local_38;
  longlong local_20;
  longlong inGenerationNumber_local;
  longlong inObjectID_local;
  XCryptionCommon *this_local;
  
  local_20 = inGenerationNumber;
  inGenerationNumber_local = inObjectID;
  inObjectID_local = (longlong)this;
  ComputeEncryptionKeyForObject_abi_cxx11_(&local_38,this,inObjectID,inGenerationNumber);
  std::__cxx11::
  list<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::push_back(&this->mEncryptionKeysStack,&local_38);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_38);
  pvVar1 = std::__cxx11::
           list<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::back(&this->mEncryptionKeysStack);
  return pvVar1;
}

Assistant:

const ByteList& XCryptionCommon::OnObjectStart(long long inObjectID, long long inGenerationNumber) {
	mEncryptionKeysStack.push_back(ComputeEncryptionKeyForObject((ObjectIDType)inObjectID, (unsigned long)inGenerationNumber));

	return mEncryptionKeysStack.back();
}